

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * uprv_decNumberInvert_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint8_t *puVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint8_t *puVar9;
  bool bVar10;
  long lVar11;
  uint8_t *puVar12;
  uint uVar13;
  uint8_t *puVar14;
  
  if ((rhs->exponent == 0) && (rhs->bits < 0x10)) {
    uVar5 = rhs->digits;
    if ((long)(int)uVar5 < 0x32) {
      uVar5 = (uint)""[(int)uVar5];
    }
    uVar2 = set->digits;
    lVar11 = (long)(int)uVar2;
    uVar7 = uVar2;
    if (lVar11 < 0x32) {
      uVar7 = (uint)""[lVar11];
    }
    uVar13 = uVar2;
    if ((int)uVar2 < 0x32) {
      uVar13 = (uint)""[lVar11];
    }
    puVar1 = res->lsu;
    puVar12 = puVar1;
    if (uVar7 != 0) {
      puVar14 = rhs->lsu;
      puVar9 = puVar14 + ((ulong)uVar5 - 1);
      do {
        if (puVar9 < puVar14) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)*puVar14;
        }
        *puVar12 = '\0';
        bVar3 = true;
        bVar10 = true;
        do {
          if (!bVar10) break;
          if ((uVar8 & 1) == 0) {
            *puVar12 = *puVar12 + '\x01';
          }
          if (1 < (uint)uVar8 + (int)(uVar8 / 10) * -10) {
            res->bits = '\0';
            res->lsu[0] = '\0';
            res->digits = 1;
            res->exponent = 0;
            res->bits = ' ';
            uprv_decContextSetStatus_63(set,0x80);
            bVar3 = false;
            break;
          }
          uVar8 = (ulong)((uint)uVar8 / 10);
          bVar10 = false;
        } while (puVar12 != res->lsu + ((ulong)uVar7 - 1) || uVar2 != uVar13);
        if (!bVar3) {
          return res;
        }
        puVar14 = puVar14 + 1;
        puVar12 = puVar12 + 1;
      } while (puVar12 <= res->lsu + ((ulong)uVar7 - 1));
    }
    iVar6 = (int)puVar12 - (int)puVar1;
    puVar9 = puVar1 + (long)iVar6 + -1;
    if (puVar1 <= puVar9) {
      iVar4 = ((int)puVar12 - (int)res) + -10;
      do {
        iVar6 = iVar4;
        if ((*puVar9 != '\0') || (iVar6 == 0)) {
          iVar6 = iVar6 + 1;
          break;
        }
        puVar9 = puVar9 + -1;
        iVar4 = iVar6 + -1;
      } while (puVar1 <= puVar9);
    }
    res->digits = iVar6;
    res->exponent = 0;
    res->bits = '\0';
  }
  else {
    res->bits = '\0';
    res->lsu[0] = '\0';
    res->digits = 1;
    res->exponent = 0;
    res->bits = ' ';
    uprv_decContextSetStatus_63(set,0x80);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberInvert(decNumber *res, const decNumber *rhs,
                            decContext *set) {
  const Unit *ua, *msua;                /* -> operand and its msu  */
  Unit  *uc, *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  if (rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }
  /* operand is valid  */
  ua=rhs->lsu;                          /* bottom-up  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, uc++) {        /* Unit loop  */
    Unit a;                             /* extract unit  */
    Int  i, j;                          /* work  */
    if (ua>msua) a=0;
     else a=*ua;
    *uc=0;                              /* can now write back  */
    /* always need to examine all bits in rhs  */
    /* This loop could be unrolled and/or use BIN2BCD tables  */
    for (i=0; i<DECDPUN; i++) {
      if ((~a)&1) *uc=*uc+(Unit)powers[i];   /* effect INVERT  */
      j=a%10;
      a=a/10;
      if (j>1) {
        decStatus(res, DEC_Invalid_operation, set);
        return res;
        }
      if (uc==msuc && i==msudigs-1) break;   /* just did final digit  */
      } /* each digit  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }